

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_clipping.cc
# Opt level: O2

bool S2::ClipEdgeBound(R2Point *a,R2Point *b,R2Rect *clip,R2Rect *bound)

{
  bool bVar1;
  uint diag;
  
  diag = -(uint)(b->c_[0] < a->c_[0] != b->c_[1] < a->c_[1]) & 1;
  bVar1 = ClipBoundAxis(a->c_[0],b->c_[0],bound->bounds_,a->c_[1],b->c_[1],bound->bounds_ + 1,diag,
                        clip->bounds_);
  if (bVar1) {
    bVar1 = ClipBoundAxis(a->c_[1],b->c_[1],bound->bounds_ + 1,a->c_[0],b->c_[0],bound->bounds_,diag
                          ,clip->bounds_ + 1);
    return bVar1;
  }
  return false;
}

Assistant:

bool ClipEdgeBound(const R2Point& a, const R2Point& b, const R2Rect& clip,
                   R2Rect* bound) {
  // "diag" indicates which diagonal of the bounding box is spanned by AB: it
  // is 0 if AB has positive slope, and 1 if AB has negative slope.  This is
  // used to determine which interval endpoints need to be updated each time
  // the edge is clipped.
  int diag = (a[0] > b[0]) != (a[1] > b[1]);
  return (ClipBoundAxis(a[0], b[0], &(*bound)[0], a[1], b[1], &(*bound)[1],
                        diag, clip[0]) &&
          ClipBoundAxis(a[1], b[1], &(*bound)[1], a[0], b[0], &(*bound)[0],
                        diag, clip[1]));
}